

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ostream.h
# Opt level: O2

int_type __thiscall fmt::v7::detail::formatbuf<char>::overflow(formatbuf<char> *this,int_type ch)

{
  char local_9;
  
  local_9 = (char)ch;
  if (ch != -1) {
    buffer<char>::push_back(this->buffer_,&local_9);
  }
  return ch;
}

Assistant:

int_type overflow(int_type ch = traits_type::eof()) FMT_OVERRIDE {
    if (!traits_type::eq_int_type(ch, traits_type::eof()))
      buffer_.push_back(static_cast<Char>(ch));
    return ch;
  }